

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  int iVar1;
  int iVar2;
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  ZSTD_DDict *pZVar3;
  uint uVar4;
  ZSTD_seqSymbol ZVar5;
  ZSTD_seqSymbol in_RSI;
  ZSTD_DDict *in_RDI;
  undefined1 in_stack_00000000 [16];
  void *in_stack_00000010;
  size_t err_code;
  ZSTD_DDictHashSet *in_stack_fffffffffffffff8;
  size_t sVar6;
  
  pZVar3 = in_RDI + 1;
  iVar1._0_2_ = (pZVar3->entropy).LLTable[0x165].nextState;
  iVar1._2_1_ = (pZVar3->entropy).LLTable[0x165].nbAdditionalBits;
  iVar1._3_1_ = (pZVar3->entropy).LLTable[0x165].nbBits;
  if (iVar1 == 0) {
    ZSTD_clearDict((ZSTD_DCtx *)0x28b2f4);
    if (in_RSI != (ZSTD_seqSymbol)0x0) {
      in_RDI[1].entropy.LLTable[0x160] = in_RSI;
      pZVar3 = in_RDI + 1;
      (pZVar3->entropy).LLTable[0x162].nextState = 0xffff;
      (pZVar3->entropy).LLTable[0x162].nbAdditionalBits = 0xff;
      (pZVar3->entropy).LLTable[0x162].nbBits = 0xff;
      pZVar3 = in_RDI + 1;
      iVar2._0_2_ = (pZVar3->entropy).LLTable[0x164].nextState;
      iVar2._2_1_ = (pZVar3->entropy).LLTable[0x164].nbAdditionalBits;
      iVar2._3_1_ = (pZVar3->entropy).LLTable[0x164].nbBits;
      if (iVar2 == 1) {
        if (in_RDI[1].entropy.LLTable[0x163] == (ZSTD_seqSymbol)0x0) {
          customMem.opaque = in_stack_00000010;
          customMem.customAlloc = (ZSTD_allocFunction)in_stack_00000000._0_8_;
          customMem.customFree = (ZSTD_freeFunction)in_stack_00000000._8_8_;
          ZVar5 = (ZSTD_seqSymbol)ZSTD_createDDictHashSet(customMem);
          in_RDI[1].entropy.LLTable[0x163] = ZVar5;
          if (in_RDI[1].entropy.LLTable[0x163] == (ZSTD_seqSymbol)0x0) {
            return 0xffffffffffffffc0;
          }
        }
        if (in_RDI[1].entropy.LLTable[0x15d] != (ZSTD_seqSymbol)0x0) {
          __assert_fail("!dctx->staticSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa231,"size_t ZSTD_DCtx_refDDict(ZSTD_DCtx *, const ZSTD_DDict *)");
        }
        customMem_00.customFree = (ZSTD_freeFunction)err_code;
        customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_00000010;
        customMem_00.opaque = ddict;
        sVar6 = ZSTD_DDictHashSet_addDDict(in_stack_fffffffffffffff8,in_RDI,customMem_00);
        uVar4 = ERR_isError(sVar6);
        if (uVar4 != 0) {
          return sVar6;
        }
      }
    }
    sVar6 = 0;
  }
  else {
    sVar6 = 0xffffffffffffffc4;
  }
  return sVar6;
}

Assistant:

size_t ZSTD_DCtx_refDDict(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    RETURN_ERROR_IF(dctx->streamStage != zdss_init, stage_wrong, "");
    ZSTD_clearDict(dctx);
    if (ddict) {
        dctx->ddict = ddict;
        dctx->dictUses = ZSTD_use_indefinitely;
        if (dctx->refMultipleDDicts == ZSTD_rmd_refMultipleDDicts) {
            if (dctx->ddictSet == NULL) {
                dctx->ddictSet = ZSTD_createDDictHashSet(dctx->customMem);
                if (!dctx->ddictSet) {
                    RETURN_ERROR(memory_allocation, "Failed to allocate memory for hash set!");
                }
            }
            assert(!dctx->staticSize);  /* Impossible: ddictSet cannot have been allocated if static dctx */
            FORWARD_IF_ERROR(ZSTD_DDictHashSet_addDDict(dctx->ddictSet, ddict, dctx->customMem), "");
        }
    }
    return 0;
}